

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

Status cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  pointer pcVar1;
  bool bVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  ulong dindex;
  ulong uVar6;
  CopyStatus CVar7;
  Directory dir;
  string fullPath;
  string fullDestPath;
  Directory local_80;
  uint local_74;
  string local_70;
  string local_50;
  
  Directory::Directory(&local_80);
  SVar3 = Directory::Load(&local_80,source,(string *)0x0);
  if (SVar3.Kind_ == Success) {
    SVar3 = MakeDirectory(destination,(mode_t *)0x0);
    uVar6 = (ulong)SVar3 >> 0x20;
    if (SVar3.Kind_ == Success) {
      local_74 = (uint)always;
      for (dindex = 0; uVar4 = Directory::GetNumberOfFiles(&local_80), dindex < uVar4;
          dindex = dindex + 1) {
        pcVar5 = Directory::GetFile(&local_80,dindex);
        if (((*pcVar5 != '.') || (pcVar5[1] != '\0')) &&
           ((pcVar5 = Directory::GetFile(&local_80,dindex), *pcVar5 != '.' ||
            ((pcVar5[1] != '.' || (pcVar5[2] != '\0')))))) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar1 = (source->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar1,pcVar1 + source->_M_string_length);
          std::__cxx11::string::append((char *)&local_70);
          Directory::GetFile(&local_80,dindex);
          std::__cxx11::string::append((char *)&local_70);
          bVar2 = FileIsDirectory(&local_70);
          if (bVar2) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            pcVar1 = (destination->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar1,pcVar1 + destination->_M_string_length);
            std::__cxx11::string::append((char *)&local_50);
            Directory::GetFile(&local_80,dindex);
            std::__cxx11::string::append((char *)&local_50);
            SVar3 = CopyADirectory(&local_70,&local_50,SUB41(local_74,0));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else if (always) {
            CVar7 = CopyFileAlways(&local_70,destination);
            SVar3 = CVar7.super_Status;
          }
          else {
            CVar7 = CopyFileIfDifferent(&local_70,destination);
            SVar3 = CVar7.super_Status;
          }
          uVar6 = (ulong)SVar3 >> 0x20;
          if (SVar3.Kind_ != Success) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0012cab8;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
      }
      SVar3.Kind_ = Success;
      SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
  }
  else {
    uVar6 = (ulong)SVar3 >> 0x20;
  }
LAB_0012cab8:
  Directory::~Directory(&local_80);
  return (Status)((ulong)SVar3 & 0xffffffff | uVar6 << 0x20);
}

Assistant:

Status SystemTools::CopyADirectory(std::string const& source,
                                   std::string const& destination, bool always)
{
  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }
  status = SystemTools::MakeDirectory(destination);
  if (!status.IsSuccess()) {
    return status;
  }

  for (size_t fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        status = SystemTools::CopyADirectory(fullPath, fullDestPath, always);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::CopyAFile(fullPath, destination, always);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  return status;
}